

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O0

void __thiscall
Eigen::SparseMatrix<double,_1,_int>::sumupDuplicates(SparseMatrix<double,_1,_int> *this)

{
  double dVar1;
  Scalar_conflict SVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  bool bVar7;
  Index IVar8;
  Index IVar9;
  int *piVar10;
  Scalar *pSVar11;
  Scalar_conflict *pSVar12;
  char *pcVar13;
  int __c;
  int __c_00;
  Index *extraout_RDX;
  Index *extraout_RDX_00;
  Index *pIVar14;
  Storage *this_00;
  int local_48;
  Index i;
  Index k;
  Index oldEnd;
  Index start;
  Index j;
  Index count;
  Scalar local_24;
  undefined1 local_20 [8];
  Matrix<int,__1,_1,_0,__1,_1> wi;
  SparseMatrix<double,_1,_int> *this_local;
  
  wi.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = (DenseIndex)this
  ;
  bVar7 = isCompressed(this);
  if (((bVar7 ^ 0xffU) & 1) == 0) {
    __assert_fail("!isCompressed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseCore/SparseMatrix.h"
                  ,0x3fc,
                  "void Eigen::SparseMatrix<double, 1>::sumupDuplicates() [_Scalar = double, _Flags = 1, _Index = int]"
                 );
  }
  IVar8 = innerSize(this);
  Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_20,(long)IVar8);
  local_24 = -1;
  DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::fill
            ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_20,&local_24);
  start = 0;
  oldEnd = 0;
  while( true ) {
    IVar8 = start;
    IVar9 = outerSize(this);
    if (IVar9 <= oldEnd) break;
    iVar3 = this->m_outerIndex[oldEnd];
    pIVar14 = this->m_innerNonZeros;
    iVar4 = pIVar14[oldEnd];
    for (local_48 = this->m_outerIndex[oldEnd]; local_48 < iVar3 + iVar4; local_48 = local_48 + 1) {
      piVar10 = (int *)internal::CompressedStorage<double,_int>::index
                                 (&this->m_data,(char *)(long)local_48,(int)pIVar14);
      iVar5 = *piVar10;
      pSVar11 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)local_20,
                           (long)iVar5);
      if (*pSVar11 < IVar8) {
        this_00 = &this->m_data;
        pSVar12 = internal::CompressedStorage<double,_int>::value(this_00,(long)local_48);
        SVar2 = *pSVar12;
        pSVar12 = internal::CompressedStorage<double,_int>::value(this_00,(long)start);
        *pSVar12 = SVar2;
        pcVar13 = internal::CompressedStorage<double,_int>::index
                            (this_00,(char *)(long)local_48,__c);
        uVar6 = *(undefined4 *)pcVar13;
        pcVar13 = internal::CompressedStorage<double,_int>::index
                            (this_00,(char *)(long)start,__c_00);
        *(undefined4 *)pcVar13 = uVar6;
        pSVar11 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)local_20,
                             (long)iVar5);
        *pSVar11 = start;
        start = start + 1;
        pIVar14 = extraout_RDX_00;
      }
      else {
        pSVar12 = internal::CompressedStorage<double,_int>::value(&this->m_data,(long)local_48);
        dVar1 = *pSVar12;
        pSVar11 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)local_20,
                             (long)iVar5);
        pSVar12 = internal::CompressedStorage<double,_int>::value(&this->m_data,(long)*pSVar11);
        *pSVar12 = dVar1 + *pSVar12;
        pIVar14 = extraout_RDX;
      }
    }
    this->m_outerIndex[oldEnd] = IVar8;
    oldEnd = oldEnd + 1;
  }
  this->m_outerIndex[this->m_outerSize] = start;
  free(this->m_innerNonZeros);
  this->m_innerNonZeros = (Index *)0x0;
  internal::CompressedStorage<double,_int>::resize
            (&this->m_data,(long)this->m_outerIndex[this->m_outerSize],0.0);
  Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_20);
  return;
}

Assistant:

void SparseMatrix<Scalar,_Options,_Index>::sumupDuplicates()
{
  eigen_assert(!isCompressed());
  // TODO, in practice we should be able to use m_innerNonZeros for that task
  Matrix<Index,Dynamic,1> wi(innerSize());
  wi.fill(-1);
  Index count = 0;
  // for each inner-vector, wi[inner_index] will hold the position of first element into the index/value buffers
  for(Index j=0; j<outerSize(); ++j)
  {
    Index start   = count;
    Index oldEnd  = m_outerIndex[j]+m_innerNonZeros[j];
    for(Index k=m_outerIndex[j]; k<oldEnd; ++k)
    {
      Index i = m_data.index(k);
      if(wi(i)>=start)
      {
        // we already meet this entry => accumulate it
        m_data.value(wi(i)) += m_data.value(k);
      }
      else
      {
        m_data.value(count) = m_data.value(k);
        m_data.index(count) = m_data.index(k);
        wi(i) = count;
        ++count;
      }
    }
    m_outerIndex[j] = start;
  }
  m_outerIndex[m_outerSize] = count;

  // turn the matrix into compressed form
  std::free(m_innerNonZeros);
  m_innerNonZeros = 0;
  m_data.resize(m_outerIndex[m_outerSize]);
}